

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_upvaluejoin(lua_State *L)

{
  int32_t iVar1;
  GCfunc *pGVar2;
  int32_t n;
  int i;
  GCRef *p [2];
  GCfunc *fn [2];
  ErrMsg in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int narg;
  lua_State *in_stack_ffffffffffffffd8;
  uint *local_20;
  long local_18 [3];
  
  narg = 0;
  while( true ) {
    if (1 < narg) {
      (in_stack_ffffffffffffffd8->nextgc).gcptr32 = *local_20;
      if (((*(byte *)((ulong)*local_20 + 4) & 3) != 0) && ((*(byte *)(local_18[0] + 4) & 4) != 0)) {
        lj_gc_barrierf((global_State *)CONCAT44(narg,in_stack_ffffffffffffffd0),
                       (GCobj *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (GCobj *)0x1914e2);
      }
      return 0;
    }
    pGVar2 = lj_lib_checkfunc((lua_State *)CONCAT44(narg,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
    local_18[narg] = (long)pGVar2;
    if (*(char *)(local_18[narg] + 6) != '\0') break;
    iVar1 = lj_lib_checkint(in_stack_ffffffffffffffd8,narg);
    in_stack_ffffffffffffffd0 = iVar1 - 1;
    if (*(byte *)(local_18[narg] + 7) <= in_stack_ffffffffffffffd0) {
      lj_err_arg((lua_State *)CONCAT44(narg,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                 in_stack_ffffffffffffffc8);
    }
    local_18[(long)narg + -2] = local_18[narg] + 0x14 + (long)(int)in_stack_ffffffffffffffd0 * 4;
    narg = narg + 1;
  }
  lj_err_arg((lua_State *)CONCAT44(narg,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
}

Assistant:

LJLIB_CF(debug_upvaluejoin)
{
  GCfunc *fn[2];
  GCRef *p[2];
  int i;
  for (i = 0; i < 2; i++) {
    int32_t n;
    fn[i] = lj_lib_checkfunc(L, 2*i+1);
    if (!isluafunc(fn[i]))
      lj_err_arg(L, 2*i+1, LJ_ERR_NOLFUNC);
    n = lj_lib_checkint(L, 2*i+2) - 1;
    if ((uint32_t)n >= fn[i]->l.nupvalues)
      lj_err_arg(L, 2*i+2, LJ_ERR_IDXRNG);
    p[i] = &fn[i]->l.uvptr[n];
  }
  setgcrefr(*p[0], *p[1]);
  lj_gc_objbarrier(L, fn[0], gcref(*p[1]));
  return 0;
}